

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereInScanEst(Parse *pParse,WhereLoopBuilder *pBuilder,ExprList *pList,tRowcnt *pnRow)

{
  bool bVar1;
  int local_4c;
  uint local_48;
  int i;
  tRowcnt nRowEst;
  tRowcnt nEst;
  int rc;
  int nRecValid;
  i64 nRow0;
  Index *p;
  tRowcnt *pnRow_local;
  ExprList *pList_local;
  WhereLoopBuilder *pBuilder_local;
  Parse *pParse_local;
  
  nRow0 = (i64)(pBuilder->pNew->u).btree.pIndex;
  p = (Index *)pnRow;
  pnRow_local = (tRowcnt *)pList;
  pList_local = (ExprList *)pBuilder;
  pBuilder_local = (WhereLoopBuilder *)pParse;
  _rc = sqlite3LogEstToInt(*((Index *)nRow0)->aiRowLogEst);
  nEst = *(tRowcnt *)&pList_local[1].a[0].pExpr;
  nRowEst = 0;
  local_48 = 0;
  local_4c = 0;
  while( true ) {
    bVar1 = false;
    if (nRowEst == 0) {
      bVar1 = local_4c < (int)*pnRow_local;
    }
    i = (int)_rc;
    if (!bVar1) break;
    nRowEst = whereEqualScanEst((Parse *)pBuilder_local,(WhereLoopBuilder *)pList_local,
                                *(Expr **)(pnRow_local + (long)local_4c * 8 + 2),(tRowcnt *)&i);
    local_48 = i + local_48;
    *(tRowcnt *)&pList_local[1].a[0].pExpr = nEst;
    local_4c = local_4c + 1;
  }
  if (nRowEst == 0) {
    if ((long)_rc < (long)(ulong)local_48) {
      local_48 = i;
    }
    *(uint *)&p->zName = local_48;
  }
  return nRowEst;
}

Assistant:

static int whereInScanEst(
  Parse *pParse,       /* Parsing & code generating context */
  WhereLoopBuilder *pBuilder,
  ExprList *pList,     /* The value list on the RHS of "x IN (v1,v2,v3,...)" */
  tRowcnt *pnRow       /* Write the revised row estimate here */
){
  Index *p = pBuilder->pNew->u.btree.pIndex;
  i64 nRow0 = sqlite3LogEstToInt(p->aiRowLogEst[0]);
  int nRecValid = pBuilder->nRecValid;
  int rc = SQLITE_OK;     /* Subfunction return code */
  tRowcnt nEst;           /* Number of rows for a single term */
  tRowcnt nRowEst = 0;    /* New estimate of the number of rows */
  int i;                  /* Loop counter */

  assert( p->aSample!=0 );
  for(i=0; rc==SQLITE_OK && i<pList->nExpr; i++){
    nEst = nRow0;
    rc = whereEqualScanEst(pParse, pBuilder, pList->a[i].pExpr, &nEst);
    nRowEst += nEst;
    pBuilder->nRecValid = nRecValid;
  }

  if( rc==SQLITE_OK ){
    if( nRowEst > nRow0 ) nRowEst = nRow0;
    *pnRow = nRowEst;
    WHERETRACE(0x10,("IN row estimate: est=%d\n", nRowEst));
  }
  assert( pBuilder->nRecValid==nRecValid );
  return rc;
}